

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sys.cpp
# Opt level: O1

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Vault::Sys::seal_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Sys *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Client *client;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c8;
  size_type local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  Path local_a8;
  Url local_88;
  _Hashtable<_ea4cb122_> local_68;
  
  client = this->client_;
  local_c8 = &local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"seal","");
  paVar1 = &local_a8.value_.field_2;
  if (local_c8 == &local_b8) {
    local_a8.value_.field_2._8_8_ = local_b8._8_8_;
    local_a8.value_._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_a8.value_._M_dataplus._M_p = (pointer)local_c8;
  }
  local_a8.value_.field_2._M_allocated_capacity._1_7_ = local_b8._M_allocated_capacity._1_7_;
  local_a8.value_.field_2._M_local_buf[0] = local_b8._M_local_buf[0];
  local_a8.value_._M_string_length = local_c0;
  local_c0 = 0;
  local_b8._M_local_buf[0] = '\0';
  local_c8 = &local_b8;
  getUrl(&local_88,this,&local_a8);
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_bucket_count = 1;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._4_4_ = 0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  HttpConsumer::put(__return_storage_ptr__,client,&local_88,(Parameters *)&local_68);
  std::_Hashtable<$ea4cb122$>::~_Hashtable(&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.value_._M_dataplus._M_p != &local_88.value_.field_2) {
    operator_delete(local_88.value_._M_dataplus._M_p,
                    local_88.value_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.value_._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8.value_._M_dataplus._M_p,
                    local_a8.value_.field_2._M_allocated_capacity + 1);
  }
  if (local_c8 != &local_b8) {
    operator_delete(local_c8,CONCAT71(local_b8._M_allocated_capacity._1_7_,local_b8._M_local_buf[0])
                             + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string> Vault::Sys::seal() {
  return HttpConsumer::put(client_, getUrl(Path{"seal"}), Parameters{});
}